

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O3

bool __thiscall
ON_Font::SetFromFontDescription(ON_Font *this,wchar_t *font_description,wchar_t *postscript_name)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  Stretch SVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  wchar_t wVar10;
  wchar_t *pwVar11;
  wchar_t *pwVar12;
  wchar_t *pwVar13;
  ulong uVar14;
  ulong uVar15;
  size_t string_length;
  undefined8 in_R8;
  Stretch SVar16;
  Stretch font_stretch;
  Style font_style;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  double linefeed_ratio;
  undefined1 in_XMM1 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  Weight local_8a;
  ON_wString local_face_name;
  wchar_t *s1;
  ON_Font *local_78;
  wchar_t *local_70;
  ON_wString local_postscript_name;
  ON_wString local_font_description;
  undefined8 local_58;
  undefined4 local_50;
  undefined4 local_4c;
  undefined4 local_48;
  undefined8 local_44;
  undefined4 local_3c;
  
  ON_wString::ON_wString(&local_font_description,font_description);
  ON_wString::TrimLeftAndRight(&local_font_description,(wchar_t *)0x0);
  pwVar11 = ON_wString::operator_cast_to_wchar_t_(&local_font_description);
  ON_wString::ON_wString(&local_postscript_name,postscript_name);
  ON_wString::TrimLeftAndRight(&local_postscript_name,(wchar_t *)0x0);
  ON_wString::operator_cast_to_wchar_t_(&local_postscript_name);
  if ((pwVar11 == (wchar_t *)0x0) || (*pwVar11 < L'!')) {
    pwVar11 = ON_wString::operator_cast_to_wchar_t_(&local_postscript_name);
    ON_wString::operator=(&local_font_description,&local_postscript_name);
    if ((pwVar11 == (wchar_t *)0x0) || (*pwVar11 < L'!')) {
      bVar5 = false;
      goto LAB_0048194b;
    }
  }
  ON_wString::ON_wString(&local_face_name,pwVar11);
  iVar6 = ON_wString::Length(&local_face_name);
  iVar7 = ON_wString::Length(L"Times New Roman");
  if ((iVar6 < iVar7) ||
     ((iVar7 < iVar6 && (pwVar12 = ON_wString::operator[](&local_face_name,iVar7), L' ' < *pwVar12))
     )) {
LAB_00481183:
    pwVar11 = ON_wString::operator_cast_to_wchar_t_(&local_face_name);
    pwVar11 = pwVar11 + 1;
  }
  else {
    in_R8 = 1;
    bVar5 = ON_wString::EqualOrdinal(L"Times New Roman",iVar7,pwVar11,iVar7,true);
    if ((!bVar5) ||
       (pwVar11 = ON_wString::operator_cast_to_wchar_t_(&local_face_name), pwVar11 == (wchar_t *)0x0
       )) goto LAB_00481183;
    pwVar11 = pwVar11 + iVar7;
  }
  linefeed_ratio = in_XMM1._0_8_;
  wVar10 = *pwVar11;
  local_8a = Default.m_font_weight;
  font_style = Default.m_font_style;
  font_stretch = Default.m_font_stretch;
  if (wVar10 != L'\0') {
    uVar15 = ~(ulong)pwVar11;
    pwVar12 = pwVar11;
    local_78 = this;
    local_70 = pwVar11;
LAB_004811cc:
    pwVar12 = pwVar12 + 1;
    if (0x19 < (uint)((wVar10 & 0xffffffdfU) - 0x41U)) goto switchD_00481299_default;
    s1 = pwVar11;
    uVar8 = ParseToken(&s1,4,(wchar_t **)&PTR_anon_var_dwarf_26bc92_0080f850,(uint *)&DAT_006af180,
                       (uint)in_R8);
    if (uVar8 == 0) {
      local_48 = 3;
      local_50 = 4;
    }
    else {
      local_50 = 0;
      if (((s1 != (wchar_t *)0x0) && ((uint)(*s1 + L'\xffffffe0') < 0x40)) &&
         ((0x8000000008007001U >> ((ulong)(uint)(*s1 + L'\xffffffe0') & 0x3f) & 1) != 0)) {
        s1 = s1 + 1;
      }
      local_48 = 0;
    }
    local_58 = (wchar_t *)0x200000001;
    local_44 = 0x600000005;
    local_3c = 6;
    local_4c = local_50;
    uVar9 = ParseToken(&s1,8,(wchar_t **)&PTR_anon_var_dwarf_26bcc2_0080f7f0,(uint *)&local_58,
                       (uint)in_R8);
    auVar3 = _DAT_0069b170;
    auVar2 = _DAT_0069b160;
    auVar1 = _DAT_0069b120;
    switch(uVar9) {
    case 1:
      local_8a = Thin;
      break;
    case 2:
      if (uVar8 < 3) {
        local_8a = Ultralight;
        break;
      }
      goto switchD_00481299_default;
    case 3:
      local_8a = Normal;
      break;
    case 4:
      local_8a = Medium;
      break;
    case 5:
      if (uVar8 < 3) {
        local_8a = Ultrabold;
        break;
      }
      goto switchD_00481299_default;
    case 6:
      local_8a = Heavy;
      break;
    default:
      goto switchD_00481299_default;
    }
    if (pwVar11 < s1) {
      pwVar13 = pwVar11 + 1;
      if (pwVar11 + 1 < s1) {
        pwVar13 = s1;
      }
      uVar14 = ~(ulong)pwVar11 + (long)pwVar13;
      if (pwVar12 < s1) {
        pwVar12 = s1;
      }
      auVar25._8_4_ = (int)uVar14;
      auVar25._0_8_ = uVar14;
      auVar25._12_4_ = (int)(uVar14 >> 0x20);
      auVar17._0_8_ = uVar14 >> 2;
      auVar17._8_8_ = auVar25._8_8_ >> 2;
      uVar14 = 0;
      auVar17 = auVar17 ^ _DAT_0069b120;
      do {
        auVar22._8_4_ = (int)uVar14;
        auVar22._0_8_ = uVar14;
        auVar22._12_4_ = (int)(uVar14 >> 0x20);
        auVar25 = (auVar22 | auVar3) ^ auVar1;
        iVar6 = auVar17._4_4_;
        if ((bool)(~(iVar6 < auVar25._4_4_ ||
                    auVar17._0_4_ < auVar25._0_4_ && auVar25._4_4_ == iVar6) & 1)) {
          pwVar11[uVar14] = L'\x01';
        }
        if (auVar25._12_4_ <= auVar17._12_4_ &&
            (auVar25._8_4_ <= auVar17._8_4_ || auVar25._12_4_ != auVar17._12_4_)) {
          pwVar11[uVar14 + 1] = L'\x01';
        }
        auVar25 = (auVar22 | auVar2) ^ auVar1;
        iVar7 = auVar25._4_4_;
        if (iVar7 <= iVar6 && (iVar7 != iVar6 || auVar25._0_4_ <= auVar17._0_4_)) {
          pwVar11[uVar14 + 2] = L'\x01';
          pwVar11[uVar14 + 3] = L'\x01';
        }
        uVar14 = uVar14 + 4;
        in_XMM1 = auVar2;
      } while ((((long)pwVar12 + uVar15 >> 2) + 4 & 0xfffffffffffffffc) != uVar14);
    }
    goto LAB_00481428;
  }
  goto LAB_004818ae;
switchD_00481299_default:
  wVar10 = pwVar11[1];
  pwVar11 = pwVar11 + 1;
  uVar15 = uVar15 - 4;
  if (wVar10 == L'\0') goto LAB_00481428;
  goto LAB_004811cc;
LAB_00481428:
  font_style = Default.m_font_style;
  linefeed_ratio = in_XMM1._0_8_;
  wVar10 = *local_70;
  this = local_78;
  font_stretch = Default.m_font_stretch;
  if (wVar10 != L'\0') {
    uVar15 = ~(ulong)local_70;
    pwVar12 = local_70;
    pwVar11 = local_70;
    do {
      pwVar11 = pwVar11 + 1;
      if ((uint)((wVar10 & 0xffffffdfU) - 0x41U) < 0x1a) {
        local_58 = pwVar12;
        uVar8 = ParseToken((wchar_t **)&local_58,4,(wchar_t **)&PTR_anon_var_dwarf_26bd22_0080f830,
                           (uint *)&DAT_006af190,(uint)in_R8);
        auVar3 = _DAT_0069b170;
        auVar2 = _DAT_0069b160;
        auVar1 = _DAT_0069b120;
        if (uVar8 - 1 < 3) {
          font_style = (char)(uVar8 - 1) + Upright;
          if (pwVar12 < local_58) {
            pwVar13 = pwVar12 + 1;
            if (pwVar12 + 1 < local_58) {
              pwVar13 = local_58;
            }
            uVar14 = ~(ulong)pwVar12 + (long)pwVar13;
            if (pwVar11 < local_58) {
              pwVar11 = local_58;
            }
            auVar18._8_4_ = (int)uVar14;
            auVar18._0_8_ = uVar14;
            auVar18._12_4_ = (int)(uVar14 >> 0x20);
            auVar19._0_8_ = uVar14 >> 2;
            auVar19._8_8_ = auVar18._8_8_ >> 2;
            uVar14 = 0;
            auVar19 = auVar19 ^ _DAT_0069b120;
            do {
              auVar23._8_4_ = (int)uVar14;
              auVar23._0_8_ = uVar14;
              auVar23._12_4_ = (int)(uVar14 >> 0x20);
              auVar25 = (auVar23 | auVar3) ^ auVar1;
              iVar6 = auVar19._4_4_;
              if ((bool)(~(iVar6 < auVar25._4_4_ ||
                          auVar19._0_4_ < auVar25._0_4_ && auVar25._4_4_ == iVar6) & 1)) {
                pwVar12[uVar14] = L'\x01';
              }
              if (auVar25._12_4_ <= auVar19._12_4_ &&
                  (auVar25._8_4_ <= auVar19._8_4_ || auVar25._12_4_ != auVar19._12_4_)) {
                pwVar12[uVar14 + 1] = L'\x01';
              }
              auVar25 = (auVar23 | auVar2) ^ auVar1;
              iVar7 = auVar25._4_4_;
              if (iVar7 <= iVar6 && (iVar7 != iVar6 || auVar25._0_4_ <= auVar19._0_4_)) {
                pwVar12[uVar14 + 2] = L'\x01';
                pwVar12[uVar14 + 3] = L'\x01';
              }
              uVar14 = uVar14 + 4;
              in_XMM1 = auVar2;
            } while ((((long)pwVar11 + uVar15 >> 2) + 4 & 0xfffffffffffffffc) != uVar14);
          }
          break;
        }
      }
      wVar10 = pwVar12[1];
      pwVar12 = pwVar12 + 1;
      uVar15 = uVar15 - 4;
    } while (wVar10 != L'\0');
    this = local_78;
    font_stretch = Default.m_font_stretch;
    linefeed_ratio = in_XMM1._0_8_;
    wVar10 = *local_70;
    if (wVar10 != L'\0') {
      uVar15 = ~(ulong)local_70;
      local_78 = (ON_Font *)CONCAT71(local_78._1_7_,4);
      pwVar11 = local_70;
      do {
        pwVar11 = pwVar11 + 1;
        if ((uint)((wVar10 & 0xffffffdfU) - 0x41U) < 0x1a) {
          s1 = local_70;
          uVar8 = ParseToken(&s1,4,(wchar_t **)&PTR_anon_var_dwarf_26bc92_0080f850,
                             (uint *)&DAT_006af190,(uint)in_R8);
          if (uVar8 == 0) {
            local_50 = 2;
          }
          else {
            local_50 = 0;
            if (((s1 != (wchar_t *)0x0) && ((uint)(*s1 + L'\xffffffe0') < 0x40)) &&
               ((0x8000000008007001U >> ((ulong)(uint)(*s1 + L'\xffffffe0') & 0x3f) & 1) != 0)) {
              s1 = s1 + 1;
              local_50 = 0;
            }
          }
          local_58 = (wchar_t *)CONCAT44(local_50,1);
          local_4c = 3;
          uVar9 = ParseToken(&s1,4,(wchar_t **)&PTR_anon_var_dwarf_26bd52_0080f870,(uint *)&local_58
                             ,(uint)in_R8);
          auVar3 = _DAT_0069b170;
          auVar2 = _DAT_0069b160;
          auVar1 = _DAT_0069b120;
          linefeed_ratio = in_XMM1._0_8_;
          if (uVar9 == 3) {
            if (uVar8 < 4) {
              local_78 = (ON_Font *)CONCAT71(local_78._1_7_,6);
              SVar16 = Extraexpanded;
              SVar4 = Ultraexpanded;
              switch(uVar8) {
              case 0:
                SVar16 = Expanded;
                break;
              case 1:
switchD_00481764_caseD_1:
                SVar16 = (Stretch)local_78;
                break;
              case 3:
switchD_00481764_caseD_3:
                SVar16 = SVar4;
              }
              goto switchD_00481764_caseD_2;
            }
          }
          else if (uVar9 == 2) {
            if (uVar8 == 0) {
              SVar16 = Medium;
              goto switchD_00481764_caseD_2;
            }
          }
          else if (uVar9 == 1) {
            SVar16 = Extracondensed;
            SVar4 = Ultracondensed;
            switch(uVar8) {
            case 0:
              SVar16 = Condensed;
            case 2:
switchD_00481764_caseD_2:
              font_stretch = SVar16;
              if (local_70 < s1) {
                pwVar12 = local_70 + 1;
                if (local_70 + 1 < s1) {
                  pwVar12 = s1;
                }
                uVar14 = ~(ulong)local_70 + (long)pwVar12;
                if (pwVar11 < s1) {
                  pwVar11 = s1;
                }
                auVar20._8_4_ = (int)uVar14;
                auVar20._0_8_ = uVar14;
                auVar20._12_4_ = (int)(uVar14 >> 0x20);
                auVar21._0_8_ = uVar14 >> 2;
                auVar21._8_8_ = auVar20._8_8_ >> 2;
                uVar14 = 0;
                linefeed_ratio = (double)DAT_0069b160;
                auVar21 = auVar21 ^ _DAT_0069b120;
                do {
                  auVar24._8_4_ = (int)uVar14;
                  auVar24._0_8_ = uVar14;
                  auVar24._12_4_ = (int)(uVar14 >> 0x20);
                  auVar25 = (auVar24 | auVar3) ^ auVar1;
                  iVar6 = auVar21._4_4_;
                  if ((bool)(~(auVar25._4_4_ == iVar6 && auVar21._0_4_ < auVar25._0_4_ ||
                              iVar6 < auVar25._4_4_) & 1)) {
                    local_70[uVar14] = L'\x01';
                  }
                  if ((auVar25._12_4_ != auVar21._12_4_ || auVar25._8_4_ <= auVar21._8_4_) &&
                      auVar25._12_4_ <= auVar21._12_4_) {
                    local_70[uVar14 + 1] = L'\x01';
                  }
                  auVar25 = (auVar24 | auVar2) ^ auVar1;
                  iVar7 = auVar25._4_4_;
                  if (iVar7 <= iVar6 && (iVar7 != iVar6 || auVar25._0_4_ <= auVar21._0_4_)) {
                    local_70[uVar14 + 2] = L'\x01';
                    local_70[uVar14 + 3] = L'\x01';
                  }
                  uVar14 = uVar14 + 4;
                } while ((((long)pwVar11 + uVar15 >> 2) + 4 & 0xfffffffffffffffc) != uVar14);
              }
              break;
            case 1:
              goto switchD_00481764_caseD_1;
            case 3:
              goto switchD_00481764_caseD_3;
            default:
              goto switchD_00481764_default;
            }
            break;
          }
        }
switchD_00481764_default:
        linefeed_ratio = in_XMM1._0_8_;
        wVar10 = local_70[1];
        local_70 = local_70 + 1;
        uVar15 = uVar15 - 4;
      } while (wVar10 != L'\0');
    }
  }
LAB_004818ae:
  pwVar11 = ON_wString::operator_cast_to_wchar_t_(&local_face_name);
  wVar10 = *pwVar11;
  if (wVar10 == L'\0') {
    string_length = 0;
  }
  else {
    uVar15 = 0;
    do {
      if (wVar10 < L' ') break;
      wVar10 = pwVar11[uVar15 + 1];
      uVar15 = uVar15 + 1;
    } while (wVar10 != L'\0');
    string_length = uVar15 & 0xffffffff;
  }
  ON_wString::SetLength(&local_face_name,string_length);
  ON_wString::TrimLeftAndRight(&local_face_name,(wchar_t *)0x0);
  pwVar11 = ON_wString::operator_cast_to_wchar_t_(&local_face_name);
  bVar5 = SetFontCharacteristics
                    (this,0.0,pwVar11,local_8a,font_style,font_stretch,false,false,linefeed_ratio,1)
  ;
  if (bVar5) {
    ON_wString::operator=(&this->m_loc_postscript_name,&local_postscript_name);
    ON_wString::operator=(&this->m_en_postscript_name,&this->m_loc_postscript_name);
  }
  ON_wString::~ON_wString(&local_face_name);
LAB_0048194b:
  ON_wString::~ON_wString(&local_postscript_name);
  ON_wString::~ON_wString(&local_font_description);
  return bVar5;
}

Assistant:

bool ON_Font::SetFromFontDescription(
  const wchar_t* font_description,
  const wchar_t* postscript_name
  )
{
  ON_wString local_font_description(font_description);
  local_font_description.TrimLeftAndRight();
  font_description = static_cast<const wchar_t*>(local_font_description);

  ON_wString local_postscript_name(postscript_name);
  local_postscript_name.TrimLeftAndRight();
  postscript_name = static_cast<const wchar_t*>(local_postscript_name);

  if (nullptr == font_description || font_description[0] <= ON_wString::Space)
  {
    font_description = local_postscript_name;
    local_font_description = local_postscript_name;
    if (nullptr == font_description || font_description[0] <= ON_wString::Space)
      return false;
  }

  // As names are discovered that do not work in the code below,
  // add a special case here.  These are typically fonts that have
  // words like Upright, Italic, Oblique, Regular, Semi, Demi, Extra, Ultra, Medium
  // Black, Heavy, ... as part of the face name and those words must not
  // be parsed as possible weight, style or stretch characteristics applied
  // to a root face name.
  const wchar_t* special_cases[] = {
    // Apple's "Times New Roman" and "Times New Roman Bold Italic" is an example of why
    // special cases are required.  The face name is "Times New Roman" and "Roman" no
    // longer indicates an upright style.
    // However, Apple's "Avenir Roman" and "Avenir Oblique" fonts provide an example
    // where "Roman" is style and "Avenir" is a face name.  The default parsing
    // handles Avenir and any other font names that are using Roman as a style.
    L"Times New Roman", 

    // Put new special case names above this nullptr which terminates the special_cases[] list.
    nullptr
  };

  // NOTE WELL: 
  //  It is important that local_face_name be created from a pointer
  //  so that it's string buffer is not shared with other ON_wStrings.
  //  wchar_t values in local_face_name are modifed via const_cast<> below.
  ON_wString local_face_name = static_cast<const wchar_t*>(font_description);
  const wchar_t* characteristics = nullptr;
  int face_name_length = local_face_name.Length();
  for (int i = 0; nullptr != special_cases[i]; i++)
  {
    const int special_case_length = ON_wString::Length(special_cases[i]);
    if (special_case_length > face_name_length)
      continue;
    
    if (special_case_length < face_name_length && local_face_name[special_case_length] > ON_wString::Space )
      continue;
    
    if (false == ON_wString::EqualOrdinal(special_cases[i], special_case_length, font_description, special_case_length, true))
      continue;

    characteristics = static_cast<const wchar_t*>(local_face_name) + special_case_length;
    break;
  }

  if (nullptr == characteristics)
    characteristics = static_cast<const wchar_t*>(local_face_name) + 1;

  const wchar_t x = (wchar_t)1;

  ON_Font::Weight font_weight = ON_Font::Default.m_font_weight;
  for (wchar_t* s0 = const_cast<wchar_t*>(characteristics); 0 != *s0; s0++)
  {
    const wchar_t* s1 = s0;
    if (ParseWeight(s1, font_weight))
    {
      while ( s0 < s1 )
        *s0++ = x; // NOTE - modifies local_face_name content
      break;
    }
  }

  ON_Font::Style font_style = ON_Font::Default.m_font_style;
  for (wchar_t* s0 = const_cast<wchar_t*>(characteristics); 0 != *s0; s0++)
  {
    const wchar_t* s1 = s0;
    if (ParseStyle(s1, font_style))
    {
      while ( s0 < s1 )
        *s0++ = x; // NOTE - modifies local_face_name content
      break;
    }
  }

  ON_Font::Stretch font_stretch = ON_Font::Default.m_font_stretch;
  for (wchar_t* s0 = const_cast<wchar_t*>(characteristics); 0 != *s0; s0++)
  {
    const wchar_t* s1 = s0;
    if (ParseStretch(s1, font_stretch))
    {
      while ( s0 < s1 )
        *s0++ = x; // NOTE - modifies local_face_name content
      break;
    }
  }

  face_name_length = 0;
  for (const wchar_t* s = static_cast<const wchar_t*>(local_face_name); 0 != *s; s++)
  {
    if (*s >= ON_wString::Space)
      face_name_length++;
    else
    {
      while (*s > 0 && *s <= ON_wString::Space)
        s++;
      break;
    }
  }
  local_face_name.SetLength(face_name_length);
  local_face_name.TrimLeftAndRight();
  const wchar_t* face_name = static_cast<const wchar_t*>(local_face_name);

  bool rc = SetFontCharacteristics(
    face_name,
    font_weight,
    font_style,
    font_stretch,
    false,
    false,
    ON_FontMetrics::DefaultLineFeedRatio,
    ON_Font::WindowsConstants::logfont_default_charset
    );

  if (rc)
  {
    m_loc_postscript_name = local_postscript_name;
    m_en_postscript_name = m_loc_postscript_name;
  }  

  return rc;
}